

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

int consume_body_streamed(http1_fio_parser_args_s *args,uint8_t **start)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *stop;
  uint8_t *end;
  uint8_t **start_local;
  http1_fio_parser_args_s *args_local;
  
  puVar2 = (uint8_t *)((long)args->buffer + args->length);
  stop = *start + ((args->parser->state).content_length - (args->parser->state).read);
  if (puVar2 < *start + ((args->parser->state).content_length - (args->parser->state).read)) {
    stop = puVar2;
  }
  if ((*start < stop) &&
     (iVar1 = (*args->on_body_chunk)(args->parser,(char *)*start,(long)stop - (long)*start),
     iVar1 != 0)) {
    return -1;
  }
  (args->parser->state).read = (ssize_t)(stop + ((args->parser->state).read - (long)*start));
  *start = stop;
  if ((args->parser->state).content_length <= (args->parser->state).read) {
    (args->parser->state).reserved = (args->parser->state).reserved | 4;
  }
  return 0;
}

Assistant:

inline static int consume_body_streamed(struct http1_fio_parser_args_s *args,
                                        uint8_t **start) {
  uint8_t *end =
      *start + args->parser->state.content_length - args->parser->state.read;
  uint8_t *const stop = ((uint8_t *)args->buffer) + args->length;
  if (end > stop)
    end = stop;
  if (end > *start &&
      args->on_body_chunk(args->parser, (char *)(*start), end - *start))
    return -1;
  args->parser->state.read += (end - *start);
  *start = end;
  if (args->parser->state.content_length <= args->parser->state.read)
    args->parser->state.reserved |= 4;
  return 0;
}